

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aead_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_18ac8a::PerAEADTest_InvalidNonceLength_Test::TestBody
          (PerAEADTest_InvalidNonceLength_Test *this)

{
  char cVar1;
  int iVar2;
  EVP_AEAD *pEVar3;
  size_t sVar4;
  ParamType *pPVar5;
  EVP_AEAD *pEVar6;
  ulong uVar7;
  pointer puVar8;
  EVP_AEAD_CTX *pEVar9;
  char *pcVar10;
  pointer puVar11;
  ScopedTrace gtest_trace_705;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_418;
  AssertionResult gtest_ar_;
  AssertHelper local_400;
  string local_3f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonce_lens;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nonce;
  size_t nonce_len;
  size_t ad_len;
  pointer local_390;
  pointer local_388;
  size_t len;
  uint8_t buf [256];
  AssertionResult gtest_ar;
  
  pEVar3 = PerAEADTest::aead(&this->super_PerAEADTest);
  sVar4 = EVP_AEAD_nonce_length(pEVar3);
  nonce_lens.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nonce_lens.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nonce_lens.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (sVar4 != 0) {
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&nonce_lens,(unsigned_long *)&gtest_ar);
  }
  pPVar5 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
  if ((pPVar5->flags & 4) == 0) {
    gtest_ar._0_8_ = sVar4 + 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&nonce_lens,(unsigned_long *)&gtest_ar);
    if (sVar4 != 0) {
      gtest_ar._0_8_ = sVar4 - 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&nonce_lens,(unsigned_long *)&gtest_ar);
    }
  }
  pPVar5 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
  if ((pPVar5->flags & 0x78) == 0) {
    ad_len = 0x10;
  }
  else {
    pPVar5 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
    ad_len = (size_t)(pPVar5->flags >> 3 & 0xf);
  }
  buf[0] = 'P';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"ad_len","sizeof(kZeros)",&ad_len,(unsigned_long *)buf);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buf);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
               ,0x2be,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3f8,(Message *)buf);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3f8);
    if (buf._0_8_ != 0) {
      (**(code **)(*(long *)buf._0_8_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_390 = nonce_lens.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_finish;
    puVar8 = nonce_lens.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    while (puVar8 != local_390) {
      nonce_len = *puVar8;
      local_388 = puVar8;
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                (&gtest_trace_705,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                 ,0x2c1,&nonce_len);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&nonce,nonce_len,(allocator_type *)&gtest_ar);
      pEVar9 = (EVP_AEAD_CTX *)&gtest_ar;
      EVP_AEAD_CTX_zero((EVP_AEAD_CTX *)&gtest_ar);
      pEVar3 = PerAEADTest::aead((PerAEADTest *)pEVar9);
      pEVar6 = PerAEADTest::aead((PerAEADTest *)pEVar9);
      sVar4 = EVP_AEAD_key_length(pEVar6);
      pcVar10 = (char *)0x1;
      iVar2 = EVP_AEAD_CTX_init_with_direction
                        ((EVP_AEAD_CTX *)&gtest_ar,pEVar3,"",sVar4,0,evp_aead_seal);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_418);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_3f8,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "EVP_AEAD_CTX_init_with_direction( ctx.get(), aead(), kZeros, EVP_AEAD_key_length(aead()), 0, evp_aead_seal)"
                   ,"false","true",pcVar10);
        testing::internal::AssertHelper::AssertHelper
                  (&local_400,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                   ,0x2c8,(char *)CONCAT71(local_3f8._M_dataplus._M_p._1_7_,
                                           (char)local_3f8._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_418);
        testing::internal::AssertHelper::~AssertHelper(&local_400);
        std::__cxx11::string::~string((string *)&local_3f8);
        if (local_418._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_418._M_head_impl + 8))();
        }
LAB_0020c4b5:
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        bssl::internal::
        StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::
        ~StackAllocated((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                         *)&gtest_ar);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&nonce.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        testing::ScopedTrace::~ScopedTrace(&gtest_trace_705);
        break;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      puVar11 = nonce.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
                -(long)nonce.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      iVar2 = EVP_AEAD_CTX_seal((EVP_AEAD_CTX *)&gtest_ar,buf,&len,0x100,
                                nonce.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,(size_t)puVar11,
                                (uint8_t *)0x0,0,"",ad_len);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar2 == 0;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)&local_418);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_3f8,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "EVP_AEAD_CTX_seal(ctx.get(), buf, &len, sizeof(buf), nonce.data(), nonce.size(), nullptr , 0, kZeros , ad_len)"
                   ,"true","false",(char *)puVar11);
        testing::internal::AssertHelper::AssertHelper
                  (&local_400,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                   ,0x2cc,(char *)CONCAT71(local_3f8._M_dataplus._M_p._1_7_,
                                           (char)local_3f8._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_418);
        testing::internal::AssertHelper::~AssertHelper(&local_400);
        std::__cxx11::string::~string((string *)&local_3f8);
        if (local_418._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_418._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      uVar7 = ERR_get_error();
      ErrorEquals((uint32_t)&gtest_ar_,(int)uVar7,0x1e);
      testing::AssertionResult::operator!((AssertionResult *)&local_3f8);
      cVar1 = (char)local_3f8._M_dataplus._M_p;
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_3f8._M_string_length);
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      if (cVar1 == '\x01') {
        ErrorEquals((uint32_t)&gtest_ar_,(int)uVar7,0x1e);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_418);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_3f8,(internal *)&gtest_ar_,
                     (AssertionResult *)"ErrorEquals(err, ERR_LIB_CIPHER, 111)","false","true",
                     (char *)puVar11);
          testing::internal::AssertHelper::AssertHelper
                    (&local_400,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                     ,0x2d1,(char *)CONCAT71(local_3f8._M_dataplus._M_p._1_7_,
                                             (char)local_3f8._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_418);
          testing::internal::AssertHelper::~AssertHelper(&local_400);
          std::__cxx11::string::~string((string *)&local_3f8);
          if (local_418._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_418._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
      pEVar9 = (EVP_AEAD_CTX *)&gtest_ar;
      bssl::internal::
      StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::Reset
                ((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup> *
                 )&gtest_ar);
      pEVar3 = PerAEADTest::aead((PerAEADTest *)pEVar9);
      pEVar6 = PerAEADTest::aead((PerAEADTest *)pEVar9);
      sVar4 = EVP_AEAD_key_length(pEVar6);
      pcVar10 = (char *)0x0;
      iVar2 = EVP_AEAD_CTX_init_with_direction
                        ((EVP_AEAD_CTX *)&gtest_ar,pEVar3,"",sVar4,0,evp_aead_open);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_418);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_3f8,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "EVP_AEAD_CTX_init_with_direction( ctx.get(), aead(), kZeros, EVP_AEAD_key_length(aead()), 0, evp_aead_open)"
                   ,"false","true",pcVar10);
        testing::internal::AssertHelper::AssertHelper
                  (&local_400,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                   ,0x2d7,(char *)CONCAT71(local_3f8._M_dataplus._M_p._1_7_,
                                           (char)local_3f8._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_418);
        testing::internal::AssertHelper::~AssertHelper(&local_400);
        std::__cxx11::string::~string((string *)&local_3f8);
        if (local_418._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_418._M_head_impl + 8))();
        }
        goto LAB_0020c4b5;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      puVar11 = nonce.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
                -(long)nonce.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      iVar2 = EVP_AEAD_CTX_open((EVP_AEAD_CTX *)&gtest_ar,buf,&len,0x100,
                                nonce.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,(size_t)puVar11,"",0x50,"",
                                ad_len);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar2 == 0;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)&local_418);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_3f8,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "EVP_AEAD_CTX_open(ctx.get(), buf, &len, sizeof(buf), nonce.data(), nonce.size(), kZeros , sizeof(kZeros), kZeros , ad_len)"
                   ,"true","false",(char *)puVar11);
        testing::internal::AssertHelper::AssertHelper
                  (&local_400,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                   ,0x2da,(char *)CONCAT71(local_3f8._M_dataplus._M_p._1_7_,
                                           (char)local_3f8._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_418);
        testing::internal::AssertHelper::~AssertHelper(&local_400);
        std::__cxx11::string::~string((string *)&local_3f8);
        if (local_418._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_418._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      uVar7 = ERR_get_error();
      ErrorEquals((uint32_t)&gtest_ar_,(int)uVar7,0x1e);
      testing::AssertionResult::operator!((AssertionResult *)&local_3f8);
      cVar1 = (char)local_3f8._M_dataplus._M_p;
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_3f8._M_string_length);
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      if (cVar1 == '\x01') {
        ErrorEquals((uint32_t)&gtest_ar_,(int)uVar7,0x1e);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_418);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_3f8,(internal *)&gtest_ar_,
                     (AssertionResult *)"ErrorEquals(err, ERR_LIB_CIPHER, 111)","false","true",
                     (char *)puVar11);
          testing::internal::AssertHelper::AssertHelper
                    (&local_400,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                     ,0x2de,(char *)CONCAT71(local_3f8._M_dataplus._M_p._1_7_,
                                             (char)local_3f8._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_418);
          testing::internal::AssertHelper::~AssertHelper(&local_400);
          std::__cxx11::string::~string((string *)&local_3f8);
          if (local_418._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_418._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
      bssl::internal::
      StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::
      ~StackAllocated((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                       *)&gtest_ar);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&nonce.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_705);
      puVar8 = local_388 + 1;
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&nonce_lens.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

TEST_P(PerAEADTest, InvalidNonceLength) {
  size_t valid_nonce_len = EVP_AEAD_nonce_length(aead());
  std::vector<size_t> nonce_lens;
  if (valid_nonce_len != 0) {
    // Other than the implicit IV TLS "AEAD"s, none of our AEADs allow empty
    // nonces. In particular, although AES-GCM was incorrectly specified with
    // variable-length nonces, it does not allow the empty nonce.
    nonce_lens.push_back(0);
  }
  if (!(GetParam().flags & kVariableNonce)) {
    nonce_lens.push_back(valid_nonce_len + 1);
    if (valid_nonce_len != 0) {
      nonce_lens.push_back(valid_nonce_len - 1);
    }
  }

  static const uint8_t kZeros[EVP_AEAD_MAX_KEY_LENGTH] = {0};
  const size_t ad_len = RequiredADLength(GetParam().flags) != 0
                            ? RequiredADLength(GetParam().flags)
                            : 16;
  ASSERT_LE(ad_len, sizeof(kZeros));

  for (size_t nonce_len : nonce_lens) {
    SCOPED_TRACE(nonce_len);
    uint8_t buf[256];
    size_t len;
    std::vector<uint8_t> nonce(nonce_len);
    bssl::ScopedEVP_AEAD_CTX ctx;
    ASSERT_TRUE(EVP_AEAD_CTX_init_with_direction(
        ctx.get(), aead(), kZeros, EVP_AEAD_key_length(aead()),
        EVP_AEAD_DEFAULT_TAG_LENGTH, evp_aead_seal));

    EXPECT_FALSE(EVP_AEAD_CTX_seal(ctx.get(), buf, &len, sizeof(buf),
                                   nonce.data(), nonce.size(), nullptr /* in */,
                                   0, kZeros /* ad */, ad_len));
    uint32_t err = ERR_get_error();
    // TODO(davidben): Merge these errors. https://crbug.com/boringssl/129.
    if (!ErrorEquals(err, ERR_LIB_CIPHER, CIPHER_R_UNSUPPORTED_NONCE_SIZE)) {
      EXPECT_TRUE(
          ErrorEquals(err, ERR_LIB_CIPHER, CIPHER_R_INVALID_NONCE_SIZE));
    }

    ctx.Reset();
    ASSERT_TRUE(EVP_AEAD_CTX_init_with_direction(
        ctx.get(), aead(), kZeros, EVP_AEAD_key_length(aead()),
        EVP_AEAD_DEFAULT_TAG_LENGTH, evp_aead_open));
    EXPECT_FALSE(EVP_AEAD_CTX_open(ctx.get(), buf, &len, sizeof(buf),
                                   nonce.data(), nonce.size(), kZeros /* in */,
                                   sizeof(kZeros), kZeros /* ad */, ad_len));
    err = ERR_get_error();
    if (!ErrorEquals(err, ERR_LIB_CIPHER, CIPHER_R_UNSUPPORTED_NONCE_SIZE)) {
      EXPECT_TRUE(
          ErrorEquals(err, ERR_LIB_CIPHER, CIPHER_R_INVALID_NONCE_SIZE));
    }
  }
}